

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pytypes.h
# Opt level: O3

void __thiscall
pybind11::detail::accessor<pybind11::detail::accessor_policies::generic_item>::operator=
          (accessor<pybind11::detail::accessor_policies::generic_item> *this,
          pair<pybind11::object,_const_char_*> *value)

{
  handle obj;
  handle key;
  object local_18;
  
  obj.m_ptr = (this->obj).m_ptr;
  key.m_ptr = (this->key).super_handle.m_ptr;
  local_18.super_handle =
       tuple_caster<std::pair,pybind11::object,char_const*>::
       cast_impl<std::pair<pybind11::object,char_const*>,0ul,1ul>(value,4,0);
  accessor_policies::generic_item::set(obj,key,local_18.super_handle);
  object::~object(&local_18);
  return;
}

Assistant:

void operator=(T &&value) && {
        Policy::set(obj, key, object_or_cast(std::forward<T>(value)));
    }